

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O3

void nn_recv_loop(nn_options_t *options,int sock)

{
  int iVar1;
  uint buflen;
  int *piVar2;
  void *buf;
  char *local_30;
  
LAB_00103fa7:
  buflen = nn_recv(sock,&local_30,0xffffffffffffffff,0);
  if ((int)buflen < 0) goto code_r0x00103fc0;
  goto LAB_00103fd8;
code_r0x00103fc0:
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 != 0xb) {
    if ((iVar1 == 0x9523dfe) || (iVar1 == 0x6e)) {
      return;
    }
LAB_00103fd8:
    nn_assert_errno(~buflen >> 0x1f,"Can\'t recv");
    nn_print_message(options,local_30,buflen);
    nn_freemsg(local_30);
  }
  goto LAB_00103fa7;
}

Assistant:

void nn_recv_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;

    for (;;) {
        rc = nn_recv (sock, &buf, NN_MSG, 0);
        if (rc < 0 && errno == EAGAIN) {
            continue;
        } else if (rc < 0 && (errno == ETIMEDOUT || errno == EFSM)) {
            return;  /*  No more messages possible  */
        } else {
            nn_assert_errno (rc >= 0, "Can't recv");
        }
        nn_print_message (options, buf, rc);
        nn_freemsg (buf);
    }
}